

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

png_uint_32 png_check_keyword(png_structrp png_ptr,png_const_charp key,png_bytep new_key)

{
  bool bVar1;
  bool bVar2;
  png_uint_32 pVar3;
  uint value;
  png_const_charp orig_key;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  png_byte ch;
  uint uVar7;
  png_uint_32 pVar8;
  bool bVar9;
  png_warning_parameters p;
  char acStack_128 [264];
  
  if (key != (png_const_charp)0x0) {
    bVar6 = *key;
    pbVar4 = (byte *)key;
    if (bVar6 == 0) {
      bVar1 = true;
      uVar7 = 0;
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      bVar2 = true;
      uVar7 = 0;
      do {
        bVar9 = (byte)(bVar6 + 0x81) < 0xa2;
        bVar1 = bVar6 < 0xa1 && bVar9;
        if (bVar6 < 0xa1 && bVar9) {
          if (bVar2) {
            if (uVar5 == 0) {
              uVar5 = (uint)bVar6;
            }
          }
          else {
            *new_key = 0x20;
            new_key = new_key + 1;
            uVar7 = uVar7 + 1;
            if (bVar6 != 0x20) {
              uVar5 = (uint)bVar6;
            }
          }
          bVar2 = true;
        }
        else {
          *new_key = bVar6;
          new_key = new_key + 1;
          uVar7 = uVar7 + 1;
          bVar2 = false;
        }
        pbVar4 = pbVar4 + 1;
        bVar6 = *pbVar4;
      } while ((bVar6 != 0) && (uVar7 < 0x4f));
    }
    bVar6 = uVar7 != 0 & bVar1;
    value = 0x20;
    if (uVar5 != 0) {
      value = uVar5;
    }
    if (bVar6 == 0) {
      value = uVar5;
    }
    new_key[-(ulong)bVar6] = 0;
    pVar8 = uVar7 - bVar6;
    pVar3 = 0;
    if (pVar8 != 0) {
      pVar3 = pVar8;
      if (*pbVar4 == 0) {
        if (value != 0) {
          png_warning_parameter((char (*) [32])acStack_128,1,key);
          png_warning_parameter_signed((char (*) [32])acStack_128,2,4,value);
          png_formatted_warning
                    (png_ptr,(char (*) [32])acStack_128,"keyword \"@1\": bad character \'0x@2\'");
        }
      }
      else {
        png_warning(png_ptr,"keyword truncated");
      }
    }
    return pVar3;
  }
  *new_key = '\0';
  return 0;
}

Assistant:

png_uint_32 /* PRIVATE */
png_check_keyword(png_structrp png_ptr, png_const_charp key, png_bytep new_key)
{
#ifdef PNG_WARNINGS_SUPPORTED
   png_const_charp orig_key = key;
#endif
   png_uint_32 key_len = 0;
   int bad_character = 0;
   int space = 1;

   png_debug(1, "in png_check_keyword");

   if (key == NULL)
   {
      *new_key = 0;
      return 0;
   }

   while (*key && key_len < 79)
   {
      png_byte ch = (png_byte)*key++;

      if ((ch > 32 && ch <= 126) || (ch >= 161 /*&& ch <= 255*/))
      {
         *new_key++ = ch; ++key_len; space = 0;
      }

      else if (space == 0)
      {
         /* A space or an invalid character when one wasn't seen immediately
          * before; output just a space.
          */
         *new_key++ = 32; ++key_len; space = 1;

         /* If the character was not a space then it is invalid. */
         if (ch != 32)
            bad_character = ch;
      }

      else if (bad_character == 0)
         bad_character = ch; /* just skip it, record the first error */
   }

   if (key_len > 0 && space != 0) /* trailing space */
   {
      --key_len; --new_key;
      if (bad_character == 0)
         bad_character = 32;
   }

   /* Terminate the keyword */
   *new_key = 0;

   if (key_len == 0)
      return 0;

#ifdef PNG_WARNINGS_SUPPORTED
   /* Try to only output one warning per keyword: */
   if (*key != 0) /* keyword too long */
      png_warning(png_ptr, "keyword truncated");

   else if (bad_character != 0)
   {
      PNG_WARNING_PARAMETERS(p)

      png_warning_parameter(p, 1, orig_key);
      png_warning_parameter_signed(p, 2, PNG_NUMBER_FORMAT_02x, bad_character);

      png_formatted_warning(png_ptr, p, "keyword \"@1\": bad character '0x@2'");
   }
#else /* !WARNINGS */
   PNG_UNUSED(png_ptr)
#endif /* !WARNINGS */

   return key_len;
}